

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextProtocol.cpp
# Opt level: O0

Status __thiscall
mognetwork::protocol::TextProtocol::onReadAllTrigger(TextProtocol *this,Data *data)

{
  char *pcVar1;
  Status SVar2;
  int iVar3;
  reference pcVar4;
  TcpSocket *pTVar5;
  size_type sVar6;
  vector<char,_std::allocator<char>_> *in_RSI;
  long in_RDI;
  int i;
  int size;
  char *l;
  Status status;
  char buffer [1024];
  size_t readed;
  bool received;
  undefined4 in_stack_fffffffffffffb58;
  int in_stack_fffffffffffffb5c;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffb60;
  iterator in_stack_fffffffffffffb68;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffb70;
  TcpSocket *in_stack_fffffffffffffb78;
  reference in_stack_fffffffffffffb80;
  value_type __x;
  reference in_stack_fffffffffffffb88;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffb90;
  int local_440;
  char local_428 [1024];
  long local_28;
  byte local_19;
  vector<char,_std::allocator<char>_> *local_18;
  
  local_19 = 0;
  local_18 = in_RSI;
  while( true ) {
    if (((local_19 ^ 0xff) & 1) == 0) {
      return Ok;
    }
    SVar2 = TcpSocket::receive(in_stack_fffffffffffffb78,(char *)in_stack_fffffffffffffb70,
                               (size_t)in_stack_fffffffffffffb68._M_current,
                               (size_t *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb5c);
    if (SVar2 != Ok) break;
    pcVar1 = local_428 + local_28;
    local_28 = local_28 + 1;
    *pcVar1 = '\0';
    std::vector<char,_std::allocator<char>_>::size
              ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x20));
    std::vector<char,_std::allocator<char>_>::resize
              (in_stack_fffffffffffffb90,(size_type)in_stack_fffffffffffffb88,
               (value_type)((ulong)in_stack_fffffffffffffb80 >> 0x38));
    pcVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x20),0);
    strcat(pcVar4,local_428);
    pcVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x20),0);
    pTVar5 = (TcpSocket *)strstr(pcVar4,"\n");
    __x = (value_type)((ulong)in_stack_fffffffffffffb80 >> 0x38);
    if (pTVar5 != (TcpSocket *)0x0) {
      pcVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x20),0);
      iVar3 = (int)pTVar5 - (int)pcVar4;
      if (iVar3 == 0) {
        std::vector<char,_std::allocator<char>_>::clear
                  ((vector<char,_std::allocator<char>_> *)0x1170b9);
        return Ok;
      }
      in_stack_fffffffffffffb68._M_current = (char *)pTVar5;
      in_stack_fffffffffffffb70 = local_18;
      std::vector<char,_std::allocator<char>_>::operator[]
                ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x20),0);
      std::vector<char,_std::allocator<char>_>::resize
                (in_stack_fffffffffffffb90,(size_type)in_stack_fffffffffffffb88,__x);
      in_stack_fffffffffffffb80 = std::vector<char,_std::allocator<char>_>::operator[](local_18,0);
      in_stack_fffffffffffffb88 =
           std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x20),0);
      pcVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x20),0);
      memcpy(in_stack_fffffffffffffb80,in_stack_fffffffffffffb88,(long)pTVar5 - (long)pcVar4);
      in_stack_fffffffffffffb90 = local_18;
      sVar6 = std::vector<char,_std::allocator<char>_>::size(local_18);
      pcVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                         (in_stack_fffffffffffffb90,sVar6 - 1);
      *pcVar4 = '\0';
      sVar6 = std::vector<char,_std::allocator<char>_>::size
                        ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x20));
      if (sVar6 != (long)(iVar3 + 2)) {
        for (local_440 = 0; local_440 < iVar3 + 1; local_440 = local_440 + 1) {
          in_stack_fffffffffffffb60 = (vector<char,_std::allocator<char>_> *)(in_RDI + 0x20);
          std::vector<char,_std::allocator<char>_>::begin
                    ((vector<char,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
          std::vector<char,_std::allocator<char>_>::erase
                    (in_stack_fffffffffffffb60,in_stack_fffffffffffffb68);
        }
      }
      local_19 = 1;
      in_stack_fffffffffffffb78 = pTVar5;
    }
  }
  return SVar2;
}

Assistant:

Socket::Status TextProtocol::onReadAllTrigger(TcpSocket::Data& data)
    {
      bool received = false;

      while (!received)
	{
	  std::size_t readed;
	  char buffer[1024];
	  
	  Socket::Status status = m_socket->receive(buffer, 1023, readed, 0);
	  if (status != Socket::Ok)
	    return status;
	  buffer[readed++] = 0;
	  m_pendingDatas.datas.resize(m_pendingDatas.datas.size() + readed);
	  std::strcat(&m_pendingDatas.datas[0], buffer);
	  char* l;
	  if ((l = std::strstr(&m_pendingDatas.datas[0], "\n")) != NULL)
	    {
	      int size = l - &m_pendingDatas.datas[0];
	      if (size == 0)
		{
		  m_pendingDatas.datas.clear();
		  break;
		}
	      
	      data.resize(l - &m_pendingDatas.datas[0] + 2);
	      std::memcpy(&data[0],
			  &m_pendingDatas.datas[0],
			  l - &m_pendingDatas.datas[0]);
	      data[data.size() - 1] = 0;
	      if (m_pendingDatas.datas.size() != size + 2)
		for (int i = 0; i < size + 1; ++i)
		  m_pendingDatas.datas.erase(m_pendingDatas.datas.begin());
	      received = true;
	    }
	}
      return Socket::Ok;
    }